

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2Polygons(LWOImporter *this,uint length)

{
  Layer *pLVar1;
  Logger *pLVar2;
  ulong __new_size;
  iterator local_70;
  iterator it;
  Face local_58;
  uint local_38;
  uint local_34;
  uint iNumVertices;
  uint iNumFaces;
  uint16_t *cursor;
  uint16_t *puStack_20;
  uint32_t type;
  uint16_t *end;
  LWOImporter *pLStack_10;
  uint length_local;
  LWOImporter *this_local;
  
  puStack_20 = (uint16_t *)(this->mFileBuffer + length);
  end._4_4_ = length;
  pLStack_10 = this;
  cursor._4_4_ = GetU4(this);
  if (cursor._4_4_ != 0x424f4e45) {
    if (cursor._4_4_ == 0x43555256) {
      pLVar2 = DefaultLogger::get();
      Logger::warn(pLVar2,"LWO2: Encountered unsupported primitive chunk (SPLINE)");
    }
    else if (cursor._4_4_ != 0x46414345) {
      if (cursor._4_4_ == 0x4d42414c) {
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,"LWO2: Encountered unsupported primitive chunk (METABALL)");
      }
      else if ((cursor._4_4_ != 0x50544348) && (cursor._4_4_ != 0x53554244)) {
        pLVar2 = DefaultLogger::get();
        Logger::error(pLVar2,"LWO2: Ignoring unknown polygon type.");
      }
    }
  }
  _iNumVertices = (uint16_t *)this->mFileBuffer;
  local_34 = 0;
  local_38 = 0;
  CountVertsAndFacesLWO2(this,&local_38,&local_34,(uint16_t **)&iNumVertices,puStack_20,0xffffffff);
  if (local_34 != 0) {
    _iNumVertices = (uint16_t *)this->mFileBuffer;
    pLVar1 = this->mCurLayer;
    __new_size = (ulong)local_34;
    LWO::Face::Face(&local_58,cursor._4_4_);
    std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::resize
              (&pLVar1->mFaces,__new_size,&local_58);
    LWO::Face::~Face(&local_58);
    local_70 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::begin
                         (&this->mCurLayer->mFaces);
    CopyFaceIndicesLWO2(this,&local_70,(uint16_t **)&iNumVertices,puStack_20);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2Polygons(unsigned int length)
{
    LE_NCONST uint16_t* const end   = (LE_NCONST uint16_t*)(mFileBuffer+length);
    const uint32_t type = GetU4();

    // Determine the type of the polygons
    switch (type)
    {
        // read unsupported stuff too (although we won't process it)
    case  AI_LWO_MBAL:
        ASSIMP_LOG_WARN("LWO2: Encountered unsupported primitive chunk (METABALL)");
        break;
    case  AI_LWO_CURV:
        ASSIMP_LOG_WARN("LWO2: Encountered unsupported primitive chunk (SPLINE)");;
        break;

        // These are ok with no restrictions
    case  AI_LWO_PTCH:
    case  AI_LWO_FACE:
    case  AI_LWO_BONE:
    case  AI_LWO_SUBD:
        break;
    default:

        // hm!? wtf is this? ok ...
        ASSIMP_LOG_ERROR("LWO2: Ignoring unknown polygon type.");
        break;
    }

    // first find out how many faces and vertices we'll finally need
    uint16_t* cursor= (uint16_t*)mFileBuffer;

    unsigned int iNumFaces = 0,iNumVertices = 0;
    CountVertsAndFacesLWO2(iNumVertices,iNumFaces,cursor,end);

    // allocate the output array and copy face indices
    if (iNumFaces)
    {
        cursor = (uint16_t*)mFileBuffer;

        mCurLayer->mFaces.resize(iNumFaces,LWO::Face(type));
        FaceList::iterator it = mCurLayer->mFaces.begin();
        CopyFaceIndicesLWO2(it,cursor,end);
    }
}